

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasWeakFields(Descriptor *descriptor,Options *options)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = -1;
  lVar3 = 0;
  do {
    iVar1 = *(int *)(descriptor + 4);
    lVar4 = lVar4 + 1;
    if (iVar1 <= lVar4) break;
    bVar2 = IsWeak((FieldDescriptor *)(lVar3 + *(long *)(descriptor + 0x28)),options);
    lVar3 = lVar3 + 0x48;
  } while (!bVar2);
  return lVar4 < iVar1;
}

Assistant:

bool HasWeakFields(const Descriptor* descriptor, const Options& options) {
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (IsWeak(descriptor->field(i), options)) return true;
  }
  return false;
}